

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skip.hpp
# Opt level: O3

void toml::detail::skip_value<toml::type_config>(location *loc,context<toml::type_config> *ctx)

{
  ulong uVar1;
  byte bVar2;
  element_type *peVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  size_t sVar8;
  result<toml::value_t,_toml::error_info> local_80;
  
  guess_value_type<toml::type_config>(&local_80,loc,ctx);
  if (local_80.is_ok_ == false) {
    failure<toml::error_info>::~failure((failure<toml::error_info> *)&local_80.field_1.succ_);
    local_80.field_1._0_4_ = 0;
  }
  if ((char)local_80.field_1._0_4_ == '\x04') {
    skip_string_like<toml::type_config>(loc,ctx);
  }
  else if ((local_80.field_1._0_4_ & 0xff) == 9) {
    skip_array_like<toml::type_config>(loc,ctx);
  }
  else if ((local_80.field_1._0_4_ & 0xff) == 10) {
    skip_inline_table_like<toml::type_config>(loc,ctx);
  }
  else {
    peVar3 = (loc->source_).
             super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    lVar4 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_start;
    uVar5 = (long)(peVar3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                  _M_impl.super__Vector_impl_data._M_finish - lVar4;
    if (loc->location_ < uVar5) {
      sVar7 = loc->line_number_;
      sVar8 = loc->column_number_;
      uVar6 = loc->location_;
      while( true ) {
        bVar2 = *(byte *)(lVar4 + uVar6);
        if (bVar2 < 0x5d) {
          if (bVar2 == 10) {
            return;
          }
          if (bVar2 == 0x2c) {
            return;
          }
        }
        else {
          if (bVar2 == 0x5d) {
            return;
          }
          if (bVar2 == 0x7d) {
            return;
          }
        }
        uVar1 = uVar6 + 1;
        if (uVar5 <= uVar1) break;
        sVar8 = sVar8 + 1;
        loc->column_number_ = sVar8;
        loc->location_ = uVar1;
        uVar6 = uVar1;
      }
      do {
        if (*(char *)(lVar4 + uVar6) == '\n') {
          sVar7 = sVar7 + 1;
          loc->line_number_ = sVar7;
          sVar8 = 1;
        }
        else {
          sVar8 = sVar8 + 1;
        }
        loc->column_number_ = sVar8;
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
      loc->location_ = uVar5;
    }
  }
  return;
}

Assistant:

void skip_value(location& loc, const context<TC>& ctx)
{
    value_t ty = guess_value_type(loc, ctx).unwrap_or(value_t::empty);
    if(ty == value_t::string)
    {
        skip_string_like(loc, ctx);
    }
    else if(ty == value_t::array)
    {
        skip_array_like(loc, ctx);
    }
    else if(ty == value_t::table)
    {
        // In case of multiline tables, it may skip key-value pair but not the
        // whole table.
        skip_inline_table_like(loc, ctx);
    }
    else // others are an "in-line" values. skip until the next line
    {
        while( ! loc.eof())
        {
            if(loc.current() == '\n')
            {
                break;
            }
            else if(loc.current() == ',' || loc.current() == ']' || loc.current() == '}')
            {
                break;
            }
            loc.advance();
        }
    }
    return;
}